

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool.cpp
# Opt level: O2

shared_ptr<ixy::Mempool> __thiscall
ixy::Mempool::allocate(Mempool *this,uint32_t num_entries,uint32_t entry_size)

{
  uintptr_t uVar1;
  Mempool *pMVar2;
  int __fd;
  ulong uVar3;
  __off_t _Var4;
  ssize_t sVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  uint buf_size;
  ulong uVar6;
  uint8_t *puVar7;
  ulong uVar8;
  dma_memory dVar9;
  shared_ptr<ixy::Mempool> sVar10;
  LogData<ixy::Pair<ixy::Pair<ixy::Pair<ixy::None,_const_char_*>,_void_*const_&>,_const_char_*>_>
  local_160;
  uintptr_t phy;
  uint8_t *local_138;
  Mempool *local_130;
  ulong local_128;
  uintptr_t addr;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_118;
  Mempool pool;
  _Deque_base<unsigned_long,_std::allocator<unsigned_long>_> local_80;
  
  buf_size = 0x800;
  if (entry_size != 0) {
    buf_size = entry_size;
  }
  if ((int)(0x200000 % (ulong)buf_size) != 0) {
    pool._8_8_ = anon_var_dwarf_2ee73;
    pool.physical_addr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&HUGE_PAGE_SIZE;
    error<ixy::Pair<ixy::Pair<ixy::None,char_const*>,unsigned_int_const&>>
              ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/mempool.cpp"
               ,0x10,"allocate",
               (LogData<ixy::Pair<ixy::Pair<ixy::None,_const_char_*>,_const_unsigned_int_&>_> *)
               &pool);
  }
  dVar9 = memory_allocate_dma((ulong)(buf_size * num_entries),false);
  local_118._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::stack<unsigned_long,std::deque<unsigned_long,std::allocator<unsigned_long>>>::
  stack<std::deque<unsigned_long,std::allocator<unsigned_long>>,void>
            ((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *)
             &local_80);
  local_130 = this;
  Mempool(&pool,(uint8_t *)dVar9.virt,buf_size,num_entries,
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_118,
          (stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *)
          &local_80);
  std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base(&local_80);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_118);
  uVar8 = 0;
  local_128 = (ulong)num_entries;
  for (uVar6 = 0; pMVar2 = local_130, local_128 != uVar6; uVar6 = uVar6 + 1) {
    puVar7 = (uint8_t *)((long)dVar9.virt + uVar8);
    local_138 = puVar7;
    uVar3 = sysconf(0x1e);
    __fd = open("/proc/self/pagemap",0);
    if (__fd == -1) {
      local_160.list.first.first.second = "failed to open pagemap";
      error<ixy::Pair<ixy::None,char_const*>>
                ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/memory.hpp"
                 ,0x19,"virt_to_phys",(LogData<ixy::Pair<ixy::None,_const_char_*>_> *)&local_160);
    }
    uVar3 = uVar3 & 0xffffffff;
    _Var4 = lseek(__fd,((ulong)puVar7 / uVar3) * 8,0);
    if (_Var4 == -1) {
      local_160.list.first.first.second = "failed to lseek pagemap";
      error<ixy::Pair<ixy::None,char_const*>>
                ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/memory.hpp"
                 ,0x1e,"virt_to_phys",(LogData<ixy::Pair<ixy::None,_const_char_*>_> *)&local_160);
    }
    phy = 0;
    sVar5 = read(__fd,&phy,8);
    if (sVar5 == -1) {
      local_160.list.first.first.second = "failed to translate address";
      error<ixy::Pair<ixy::None,char_const*>>
                ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/memory.hpp"
                 ,0x23,"virt_to_phys",(LogData<ixy::Pair<ixy::None,_const_char_*>_> *)&local_160);
    }
    close(__fd);
    uVar1 = phy;
    if (phy == 0) {
      local_160.list.first.first.second = "failed to translate virtual address ";
      local_160.list.first.second = &local_138;
      local_160.list.second = " to physical address";
      error<ixy::Pair<ixy::Pair<ixy::Pair<ixy::None,char_const*>,void*const&>,char_const*>>
                ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/memory.hpp"
                 ,0x29,"virt_to_phys",&local_160);
      puVar7 = local_138;
    }
    addr = (ulong)puVar7 % uVar3 + (uVar1 & 0x7fffffffffffff) * uVar3;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&pool.physical_addr,&addr)
    ;
    local_160.list.first.first._0_8_ = uVar6;
    std::deque<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              (&pool.free_stack.c,(unsigned_long *)&local_160);
    uVar8 = (ulong)((int)uVar8 + buf_size);
  }
  std::make_shared<ixy::Mempool,ixy::Mempool>(local_130);
  ~Mempool(&pool);
  sVar10.super___shared_ptr<ixy::Mempool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar10.super___shared_ptr<ixy::Mempool,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pMVar2;
  return (shared_ptr<ixy::Mempool>)
         sVar10.super___shared_ptr<ixy::Mempool,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

auto Mempool::allocate(uint32_t num_entries, uint32_t entry_size) -> std::shared_ptr<Mempool> {
    entry_size = entry_size ? entry_size : 2048;
    // require entries that neatly fit into the page size, this makes the memory pool much easier
    // otherwise our base_addr + index * size formula would be wrong because we can't cross a page-boundary
    if (HUGE_PAGE_SIZE % entry_size) {
        error("entry size must be a divisor of the huge page size " << HUGE_PAGE_SIZE);
    }

    struct dma_memory mem = memory_allocate_dma(num_entries * entry_size, false);
    auto pool = Mempool{static_cast<uint8_t *>(mem.virt), entry_size, num_entries, std::vector<uint64_t>(),
                        std::stack<uint64_t>()};

    for (uint32_t i = 0; i < num_entries; i++) {
        auto addr = virt_to_phys(static_cast<uint8_t *>(mem.virt) + (i * entry_size));
        pool.physical_addr.push_back(addr);
        pool.free_stack.push(i);
    }

    return std::make_shared<Mempool>(std::move(pool));
}